

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  StringPtr **ppSVar1;
  char cVar2;
  Disposer *pDVar3;
  IdsByNameMap *pIVar4;
  PromiseNode *pPVar5;
  char *pcVar6;
  size_t sVar7;
  undefined4 uVar8;
  AsyncInputStream *pAVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Header *pHVar15;
  TransformPromiseNodeBase *this_00;
  HttpHeaderTable *this_01;
  _func_int **pp_Var16;
  int __flags_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  undefined4 in_register_00000034;
  HttpHeaderTable *pHVar18;
  StringPtr *pSVar19;
  undefined4 in_register_00000084;
  void *pvVar20;
  void *__arg;
  __fn *in_R9;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar21;
  char *in_stack_00000008;
  Own<kj::HttpHeaders> headersCopy;
  String statusTextCopy;
  OneWayPipe pipe;
  Own<kj::_::PromiseNode> local_108;
  RemoveConst<kj::HttpHeaders::Header> *local_f8;
  Header *pHStack_f0;
  String local_e8;
  Own<kj::_::PromiseNode> local_d0;
  OneWayPipe local_c0;
  undefined1 local_a0 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_78;
  Header *pHStack_70;
  char local_68;
  Array<char> *local_60;
  Maybe<unsigned_long> local_40;
  size_t sVar17;
  
  pvVar20 = (void *)CONCAT44(in_register_00000084,__flags);
  pHVar18 = (HttpHeaderTable *)CONCAT44(in_register_00000034,__fd);
  sVar17 = __n;
  __arg = pvVar20;
  heapString(&local_e8,(long)pvVar20 - 1);
  __flags_00 = (int)sVar17;
  __child_stack = extraout_RDX;
  if ((long)pvVar20 - 1U != 0) {
    pSVar19 = (StringPtr *)local_e8.content.size_;
    if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
      pSVar19 = (StringPtr *)local_e8.content.ptr;
    }
    memcpy(pSVar19,(void *)__n,(long)pvVar20 - 1U);
    __child_stack = extraout_RDX_00;
  }
  HttpHeaders::clone((HttpHeaders *)local_a0,in_R9,__child_stack,__flags_00,__arg);
  heap<kj::HttpHeaders>((kj *)&local_f8,(HttpHeaders *)local_a0);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_a0);
  cVar2 = *in_stack_00000008;
  if (cVar2 == '\x01') {
    if (*(long *)(in_stack_00000008 + 8) == 0) {
      local_a0._8_4_ = (int)__buf;
      local_a0._16_8_ = local_e8.content.ptr;
      local_a0._24_8_ = local_e8.content.size_;
      local_a0._32_8_ = local_e8.content.disposer;
      local_e8.content.ptr = (char *)0x0;
      local_e8.content.size_ = 0;
      local_78 = local_f8;
      pHStack_70 = pHStack_f0;
      pHStack_f0 = (Header *)0x0;
      local_60 = *(Array<char> **)(in_stack_00000008 + 8);
      local_a0._0_8_ = pHVar18;
      local_68 = cVar2;
      this_00 = (TransformPromiseNodeBase *)operator_new(0x70);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(Own<kj::_::PromiseNode> *)&(pHVar18->idsByName).ptr,
                 _::
                 TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4458:26),_kj::_::PropagateException>
                 ::anon_class_72_5_009bee8d_for_func::operator());
      (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00463210;
      this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_a0._0_8_;
      *(undefined4 *)&this_00[1].dependency.disposer = local_a0._8_4_;
      this_00[1].dependency.ptr = (PromiseNode *)local_a0._16_8_;
      this_00[1].continuationTracePtr = (void *)local_a0._24_8_;
      this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_a0._32_8_;
      local_a0._16_8_ = (char *)0x0;
      local_a0._24_8_ = (Header *)0x0;
      this_00[2].dependency.disposer = (Disposer *)local_78;
      this_00[2].dependency.ptr = (PromiseNode *)pHStack_70;
      pHStack_70 = (Header *)0x0;
      *(char *)&this_00[2].continuationTracePtr = local_68;
      if (local_68 == '\x01') {
        this_00[3].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_60;
      }
      local_d0.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
            ::instance;
      local_d0.ptr = (PromiseNode *)this_00;
      this_01 = (HttpHeaderTable *)operator_new(0x28);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_01,&local_d0,_::IdentityFunc<void>::operator());
      (this_01->namesById).builder.ptr = (StringPtr *)&PTR_onReady_00463298;
      local_108.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
            ::instance;
      local_108.ptr = (PromiseNode *)this_01;
      OVar21 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                         ((kj *)&local_c0,&local_108);
      pAVar9 = local_c0.in.ptr;
      pPVar5 = local_108.ptr;
      if ((HttpHeaderTable *)local_108.ptr != (HttpHeaderTable *)0x0) {
        local_108.ptr = (PromiseNode *)0x0;
        (**(local_108.disposer)->_vptr_Disposer)
                  (local_108.disposer,
                   (((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder).ptr[-1].content.
                   ptr + (long)&((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder,
                   OVar21.ptr);
      }
      pIVar4 = (pHVar18->idsByName).ptr;
      pSVar19 = pHVar18[1].namesById.builder.ptr;
      (pHVar18->idsByName).ptr =
           (IdsByNameMap *)CONCAT44(local_c0.in.disposer._4_4_,local_c0.in.disposer._0_4_);
      pHVar18[1].namesById.builder.ptr = (StringPtr *)pAVar9;
      if (pSVar19 != (StringPtr *)0x0) {
        (*(code *)*(pIVar4->map)._M_h._M_buckets)
                  (pIVar4,*(_func_int **)((long)(pSVar19->content).ptr + -0x10) +
                          (long)&pSVar19->content);
      }
      pPVar5 = local_d0.ptr;
      if ((TransformPromiseNodeBase *)local_d0.ptr != (TransformPromiseNodeBase *)0x0) {
        local_d0.ptr = (PromiseNode *)0x0;
        (**(local_d0.disposer)->_vptr_Disposer)
                  (local_d0.disposer,
                   ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
      }
      if (pHStack_70 != (Header *)0x0) {
        pHStack_70 = (Header *)0x0;
        (**(_func_int **)(local_78->name).content.ptr)();
      }
      uVar14 = local_a0._24_8_;
      uVar13 = local_a0._16_8_;
      if ((char *)local_a0._16_8_ != (char *)0x0) {
        local_a0._16_8_ = (char *)0x0;
        local_a0._24_8_ = (Header *)0x0;
        (**(_func_int **)(((StringPtr *)local_a0._32_8_)->content).ptr)
                  (local_a0._32_8_,uVar13,1,uVar14,uVar14,0);
      }
      pp_Var16 = (_func_int **)operator_new(8);
      *pp_Var16 = (_func_int *)&PTR_write_00462c68;
      (this->super_Response)._vptr_Response =
           (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::NullOutputStream>::instance;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var16;
      goto LAB_002f4863;
    }
    local_40.ptr.field_1 =
         *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8);
  }
  local_40.ptr.isSet = (bool)cVar2;
  newOneWayPipe(&local_c0,&local_40);
  ppSVar1 = &(pHVar18->namesById).builder.endPtr;
  *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
  local_108.disposer = (Disposer *)&(pHVar18->namesById).builder.pos;
  local_108.ptr = (PromiseNode *)pHVar18;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
            ((Promise<void> *)local_a0,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
             &(pHVar18->idsByName).ptr);
  pHVar15 = (Header *)operator_new(0x30);
  pPVar5 = local_108.ptr;
  uVar8 = local_c0.in.ptr._0_4_;
  uVar10 = local_c0.in.ptr._4_4_;
  local_c0.in.ptr = (AsyncInputStream *)0x0;
  uVar11 = local_a0._8_4_;
  uVar12 = local_a0._12_4_;
  local_a0._8_8_ = (StringPtr *)0x0;
  (pHVar15->name).content.ptr = (char *)&PTR_read_00462ce8;
  *(undefined4 *)&(pHVar15->name).content.size_ = local_c0.in.disposer._0_4_;
  *(undefined4 *)((long)&(pHVar15->name).content.size_ + 4) = local_c0.in.disposer._4_4_;
  *(undefined4 *)&(pHVar15->value).content.ptr = uVar8;
  *(undefined4 *)((long)&(pHVar15->value).content.ptr + 4) = uVar10;
  *(undefined1 *)&(pHVar15->value).content.size_ = 1;
  *(undefined4 *)&pHVar15[1].name.content.ptr = local_a0._0_4_;
  *(undefined4 *)((long)&pHVar15[1].name.content.ptr + 4) = local_a0._4_4_;
  *(undefined4 *)&pHVar15[1].name.content.size_ = uVar11;
  *(undefined4 *)((long)&pHVar15[1].name.content.size_ + 4) = uVar12;
  if ((HttpHeaderTable *)local_108.ptr != (HttpHeaderTable *)0x0) {
    local_108.ptr = (PromiseNode *)0x0;
    (**(local_108.disposer)->_vptr_Disposer)
              (local_108.disposer,
               (((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder).ptr[-1].content.ptr
               + (long)&((Vector<kj::StringPtr> *)&pPVar5->_vptr_PromiseNode)->builder);
  }
  pDVar3 = (pHVar18->idsByName).disposer;
  local_a0._0_4_ = (int)__buf;
  local_a0._8_8_ = (StringPtr *)0x385fb3;
  if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
    local_a0._8_8_ = local_e8.content.ptr;
  }
  local_a0._16_8_ =
       (long)&((ArrayPtr<const_char> *)local_e8.content.size_)->ptr +
       (ulong)((StringPtr *)local_e8.content.size_ == (StringPtr *)0x0);
  local_a0._24_8_ = pHStack_f0;
  local_78 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x40);
  (local_78->name).content.ptr = (char *)&PTR___cxa_pure_virtual_00453a18;
  (local_78->name).content.size_ = (size_t)local_f8;
  (local_78->value).content.ptr = (char *)pHStack_f0;
  pHStack_f0 = (Header *)0x0;
  (local_78->value).content.size_ = (size_t)local_e8.content.ptr;
  local_78[1].name.content.ptr = (char *)local_e8.content.size_;
  local_78[1].name.content.size_ = (size_t)local_e8.content.disposer;
  local_e8.content.ptr = (char *)0x0;
  local_e8.content.size_ = 0;
  local_78[1].value.content.ptr = "P/F";
  local_78[1].value.content.size_ = (size_t)pHVar15;
  (local_78->name).content.ptr = (char *)&PTR_disposeImpl_00464e50;
  local_a0._32_4_ = 1;
  pHStack_70 = pHVar15;
  (**pDVar3->_vptr_Disposer)(pDVar3,local_a0);
  OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
            ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_a0 + 0x20));
  pAVar9 = local_c0.in.ptr;
  (this->super_Response)._vptr_Response = (_func_int **)local_c0.out.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_c0.out.ptr;
  local_c0.out.ptr = (AsyncOutputStream *)0x0;
  if ((StringPtr *)local_c0.in.ptr != (StringPtr *)0x0) {
    local_c0.in.ptr = (AsyncInputStream *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_c0.in.disposer._4_4_,local_c0.in.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_c0.in.disposer._4_4_,local_c0.in.disposer._0_4_),
               *(_func_int **)
                ((long)((ArrayPtr<const_char> *)&pAVar9->_vptr_AsyncInputStream)->ptr + -0x10) +
               (long)&pAVar9->_vptr_AsyncInputStream);
  }
LAB_002f4863:
  if (pHStack_f0 != (Header *)0x0) {
    pHStack_f0 = (Header *)0x0;
    (**(_func_int **)(local_f8->name).content.ptr)();
  }
  sVar7 = local_e8.content.size_;
  pcVar6 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(_func_int **)(((StringPtr *)&(local_e8.content.disposer)->_vptr_ArrayDisposer)->content).ptr
    )(local_e8.content.disposer,pcVar6,1,sVar7,sVar7,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }